

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::draw(SlicePlane *this)

{
  bool *pbVar1;
  element_type *peVar2;
  float *pfVar3;
  vec<3,_float,_(glm::qualifier)0> *pvVar4;
  long in_RDI;
  mat4 projMat;
  mat4 viewMat;
  allocator local_199;
  string local_198 [32];
  undefined8 local_178;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_170;
  undefined8 local_168;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_160;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [119];
  allocator local_69;
  string local_68 [104];
  
  pbVar1 = PersistentValue<bool>::get((PersistentValue<bool> *)(in_RDI + 0x68));
  if ((*pbVar1 & 1U) != 0) {
    view::getCameraViewMatrix();
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x38b7a3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"u_viewMatrix",&local_69);
    pfVar3 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x38b7eb);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_68,pfVar3);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    view::getCameraPerspectiveMatrix();
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x38b84d);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,"u_projMatrix",&local_e1);
    pfVar3 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x38b88c);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_e0,pfVar3);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_e1);
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x38b8de);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"u_objectMatrix",&local_109);
    PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::get
              ((PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *)(in_RDI + 0x90));
    pfVar3 = glm::value_ptr<float,(glm::qualifier)0>
                       ((mat<4,_4,_float,_(glm::qualifier)0> *)0x38b935);
    (*peVar2->_vptr_ShaderProgram[7])(peVar2,local_108,pfVar3);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_109);
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x38b987);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"u_lengthScale",&local_131);
    (*peVar2->_vptr_ShaderProgram[6])(polyscope::state::lengthScale,peVar2,local_130);
    std::__cxx11::string::~string(local_130);
    std::allocator<char>::~allocator((allocator<char> *)&local_131);
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x38ba0a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"u_color",&local_159);
    pvVar4 = PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::get
                       ((PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *)(in_RDI + 0xf0));
    local_170 = pvVar4->field_2;
    local_178._0_4_ = pvVar4->field_0;
    local_178._4_4_ = pvVar4->field_1;
    local_168 = local_178;
    local_160 = local_170;
    (*peVar2->_vptr_ShaderProgram[9])(local_178,(ulong)(uint)local_170,peVar2,local_158);
    std::__cxx11::string::~string(local_158);
    std::allocator<char>::~allocator((allocator<char> *)&local_159);
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x38bae7);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"u_transparency",&local_199);
    pfVar3 = PersistentValue<float>::get((PersistentValue<float> *)(in_RDI + 0x120));
    (*peVar2->_vptr_ShaderProgram[5])((ulong)(uint)*pfVar3,peVar2,local_198);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    (**(code **)(*render::engine + 0x50))(render::engine,0);
    (**(code **)(*render::engine + 0x68))(render::engine,0);
    (**(code **)(*render::engine + 0x120))();
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x38bbb8);
    (*peVar2->_vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void SlicePlane::draw() {
  if (!drawPlane.get()) return;

  // Set uniforms
  glm::mat4 viewMat = view::getCameraViewMatrix();
  planeProgram->setUniform("u_viewMatrix", glm::value_ptr(viewMat));
  glm::mat4 projMat = view::getCameraPerspectiveMatrix();
  planeProgram->setUniform("u_projMatrix", glm::value_ptr(projMat));

  planeProgram->setUniform("u_objectMatrix", glm::value_ptr(objectTransform.get()));
  planeProgram->setUniform("u_lengthScale", state::lengthScale);
  planeProgram->setUniform("u_color", color.get());
  planeProgram->setUniform("u_transparency", transparency.get());

  // glm::vec3 center{objectTransform.get()[3][0], objectTransform.get()[3][1], objectTransform.get()[3][2]};
  // planeProgram->setUniform("u_center", center);

  render::engine->setDepthMode(DepthMode::Less);
  render::engine->setBackfaceCull(false);
  render::engine->applyTransparencySettings();
  planeProgram->draw();
}